

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hnsw.hpp
# Opt level: O0

void __thiscall hnsw::HNSWIndex::SaveIndex(HNSWIndex *this,char *filename)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  reference pvVar3;
  size_type sVar4;
  reference ppVar5;
  uint *puVar6;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *in_RSI;
  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  *in_RDI;
  pair<unsigned_int,_float> p;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *__range4
  ;
  vector<unsigned_int,_std::allocator<unsigned_int>_> edges;
  index_t num_neighbors;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *neighbors;
  iterator __end3;
  iterator __begin3;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *__range3;
  index_t i;
  ofstream os;
  value_type_conflict1 *__x;
  pair<unsigned_int,_float> in_stack_fffffffffffffd80;
  __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_270;
  reference local_268;
  undefined4 local_244;
  reference local_240;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *local_238;
  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
  local_230;
  reference local_228;
  uint local_220 [4];
  value_type_conflict1 local_210 [128];
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *local_10
  ;
  
  local_10 = in_RSI;
  _Var2 = std::operator|(_S_bin,_S_out);
  __x = local_210;
  std::ofstream::ofstream(__x,(char *)in_RSI,_Var2);
  std::ostream::write((char *)__x,(long)(in_RDI + 0x16));
  for (local_220[0] = 0; local_220[0] < *(uint *)&in_RDI[0x16]._M_current;
      local_220[0] = local_220[0] + 1) {
    std::ostream::write((char *)local_210,(long)local_220);
    pvVar3 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
             operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_> *
                        )(in_RDI + 6),(ulong)local_220[0]);
    std::ostream::write((char *)local_210,(long)&pvVar3->layer);
    local_228 = std::vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>::
                operator[]((vector<hnsw::HNSWIndex::Vertex,_std::allocator<hnsw::HNSWIndex::Vertex>_>
                            *)(in_RDI + 6),(ulong)local_220[0]);
    local_230._M_current =
         (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *
         )std::
          vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
          ::begin((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   *)in_RSI);
    local_238 = (vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                 *)std::
                   vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                   ::end((vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                          *)in_RSI);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                          *)in_RDI,
                         (__normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                          *)in_RSI);
      if (!bVar1) break;
      local_240 = __gnu_cxx::
                  __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
                  ::operator*(&local_230);
      sVar4 = std::
              vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
              ::size(local_240);
      local_244 = (undefined4)sVar4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11488f);
      local_268 = local_240;
      local_270._M_current =
           (pair<unsigned_int,_float> *)
           std::
           vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           ::begin(in_RSI);
      std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
      ::end(in_RSI);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (in_RDI,(__normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                   *)in_RSI);
        if (!bVar1) break;
        ppVar5 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                 ::operator*(&local_270);
        in_stack_fffffffffffffd80 = *ppVar5;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd80,
                   __x);
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
        ::operator++(&local_270);
      }
      std::ostream::write((char *)local_210,(long)&local_244);
      puVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x114956);
      std::ostream::write((char *)local_210,(long)puVar6);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd80);
      __gnu_cxx::
      __normal_iterator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_*,_std::vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>_>
      ::operator++(&local_230);
    }
  }
  std::ofstream::close();
  printf("Saved index to %s\n",local_10);
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void SaveIndex(const char *filename) {
    std::ofstream os(filename, std::ios::binary | std::ios::out);
    os.write((char *)&num_points_, sizeof(index_t));

    for (index_t i = 0; i < num_points_; i++) {
      os.write((char *)&i, sizeof(index_t));
      os.write((char *)&vertices_[i].layer, sizeof(layer_t));
      for (const auto &neighbors : vertices_[i].neighbors) {
        index_t num_neighbors = neighbors.size();
        std::vector<index_t> edges;
        for (const auto p : neighbors) {
          edges.push_back(p.first);
        }
        os.write((char *)&num_neighbors, sizeof(index_t));
        os.write((char *)edges.data(), sizeof(index_t) * num_neighbors);
      }
    }
    os.close();
    printf("Saved index to %s\n", filename);
  }